

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::Reflection
          (Reflection *this,Descriptor *descriptor,ReflectionSchema *schema,DescriptorPool *pool,
          MessageFactory *factory)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  
  this->descriptor_ = descriptor;
  puVar1 = schema->offsets_;
  puVar2 = schema->has_bit_indices_;
  iVar4 = schema->has_bits_offset_;
  iVar5 = schema->metadata_offset_;
  iVar6 = schema->extensions_offset_;
  iVar7 = schema->oneof_case_offset_;
  iVar8 = schema->object_size_;
  iVar9 = schema->weak_field_map_offset_;
  puVar3 = schema->inlined_string_indices_;
  iVar10 = schema->inlined_string_donated_offset_;
  uVar11 = *(undefined4 *)&schema->field_0x3c;
  (this->schema_).default_instance_ = schema->default_instance_;
  (this->schema_).offsets_ = puVar1;
  (this->schema_).has_bit_indices_ = puVar2;
  (this->schema_).has_bits_offset_ = iVar4;
  (this->schema_).metadata_offset_ = iVar5;
  (this->schema_).extensions_offset_ = iVar6;
  (this->schema_).oneof_case_offset_ = iVar7;
  (this->schema_).object_size_ = iVar8;
  (this->schema_).weak_field_map_offset_ = iVar9;
  (this->schema_).inlined_string_indices_ = puVar3;
  (this->schema_).inlined_string_donated_offset_ = iVar10;
  *(undefined4 *)&(this->schema_).field_0x3c = uVar11;
  if (pool == (DescriptorPool *)0x0) {
    pool = DescriptorPool::internal_generated_pool();
    descriptor = this->descriptor_;
  }
  this->descriptor_pool_ = pool;
  this->message_factory_ = factory;
  this->last_non_weak_field_index_ = *(int *)(descriptor + 4) + -1;
  return;
}

Assistant:

Reflection::Reflection(const Descriptor* descriptor,
                       const internal::ReflectionSchema& schema,
                       const DescriptorPool* pool, MessageFactory* factory)
    : descriptor_(descriptor),
      schema_(schema),
      descriptor_pool_(
          (pool == nullptr) ? DescriptorPool::internal_generated_pool() : pool),
      message_factory_(factory),
      last_non_weak_field_index_(-1) {
  last_non_weak_field_index_ = descriptor_->field_count() - 1;
}